

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::FieldGenerator::SetOneofIndexBase
          (FieldGenerator *this,int index_base)

{
  OneofDescriptor *pOVar1;
  char *pcVar2;
  mapped_type *this_00;
  int __c;
  char *in_RSI;
  long in_RDI;
  int index;
  int in_stack_ffffffffffffff3c;
  AlphaNum *in_stack_ffffffffffffff40;
  AlphaNum *in_stack_ffffffffffffff78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff80;
  string local_30 [32];
  int local_10;
  int local_c;
  
  local_c = (int)in_RSI;
  pOVar1 = FieldDescriptor::containing_oneof(*(FieldDescriptor **)(in_RDI + 8));
  if (pOVar1 != (OneofDescriptor *)0x0) {
    pOVar1 = FieldDescriptor::containing_oneof(*(FieldDescriptor **)(in_RDI + 8));
    pcVar2 = OneofDescriptor::index(pOVar1,in_RSI,__c);
    local_10 = (int)pcVar2 + local_c;
    strings::AlphaNum::AlphaNum(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    StrCat_abi_cxx11_(in_stack_ffffffffffffff78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff80,"has_index",(allocator *)&stack0xffffffffffffff7f)
    ;
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
    std::__cxx11::string::operator=((string *)this_00,local_30);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void FieldGenerator::SetOneofIndexBase(int index_base) {
  if (descriptor_->containing_oneof() != NULL) {
    int index = descriptor_->containing_oneof()->index() + index_base;
    // Flip the sign to mark it as a oneof.
    variables_["has_index"] = StrCat(-index);
  }
}